

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometryBackgroundBorder.cpp
# Opt level: O0

void __thiscall
Rml::GeometryBackgroundBorder::DrawArcArc
          (GeometryBackgroundBorder *this,Vector2f pos_center,float R,Vector2f r,float a0,float a1,
          ColourbPremultiplied color0,ColourbPremultiplied color1,int num_points)

{
  code *pcVar1;
  bool bVar2;
  ColourbPremultiplied CVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  int local_a4;
  int i_1;
  Vector2<float> local_98;
  Vector2f local_90;
  Vector2f local_88;
  Vector2f local_80;
  Vector2<float> local_74;
  Vector2f local_6c;
  Vector2<float> local_64;
  Vector2f unit_vector;
  ColourbPremultiplied color;
  float a;
  float t;
  int i;
  int offset_indices;
  int offset_vertices;
  int num_triangles;
  int num_points_local;
  float a1_local;
  float a0_local;
  float R_local;
  GeometryBackgroundBorder *this_local;
  ColourbPremultiplied color1_local;
  ColourbPremultiplied color0_local;
  Vector2f r_local;
  Vector2f pos_center_local;
  
  if (((((num_points < 2) || (R <= 0.0)) ||
       (color1_local = (ColourbPremultiplied)r.x, (float)color1_local <= 0.0)) ||
      (color0_local = (ColourbPremultiplied)r.y, (float)color0_local <= 0.0)) &&
     (bVar2 = Assert("RMLUI_ASSERT(num_points >= 2 && R > 0 && r.x > 0 && r.y > 0)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/GeometryBackgroundBorder.cpp"
                     ,0x104), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  sVar4 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::size(this->vertices);
  iVar7 = (int)sVar4;
  sVar4 = ::std::vector<int,_std::allocator<int>_>::size(this->indices);
  iVar8 = (int)sVar4;
  ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::resize
            (this->vertices,(long)(iVar7 + num_points * 2));
  ::std::vector<int,_std::allocator<int>_>::resize
            (this->indices,(long)(iVar8 + (num_points + -1) * 6));
  for (a = 0.0; (int)a < num_points; a = (float)((int)a + 1)) {
    fVar9 = (float)(int)a / (float)(num_points + -1);
    fVar10 = Math::Lerp<float>(fVar9,a0,a1);
    unit_vector.x = (float)color1;
    unit_vector.y = (float)color0;
    CVar3 = Math::RoundedLerp(fVar9,color0,color1);
    fVar9 = Math::Cos(fVar10);
    fVar10 = Math::Sin(fVar10);
    Vector2<float>::Vector2(&local_64,fVar9,fVar10);
    local_80 = r;
    local_74 = Vector2<float>::operator*(&local_64,r);
    local_88 = pos_center;
    local_6c = Vector2<float>::operator+(&local_74,pos_center);
    pvVar5 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::operator[]
                       (this->vertices,(long)(iVar7 + (int)a * 2));
    pvVar5->position = local_6c;
    pvVar5 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::operator[]
                       (this->vertices,(long)(iVar7 + (int)a * 2));
    pvVar5->colour = CVar3;
    local_98 = Vector2<float>::operator*(&local_64,R);
    local_90 = Vector2<float>::operator+(&local_98,pos_center);
    pvVar5 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::operator[]
                       (this->vertices,(long)(iVar7 + (int)a * 2 + 1));
    pvVar5->position = local_90;
    pvVar5 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::operator[]
                       (this->vertices,(long)(iVar7 + (int)a * 2 + 1));
    pvVar5->colour = CVar3;
  }
  for (local_a4 = 0; local_a4 < (num_points + -1) * 2; local_a4 = local_a4 + 2) {
    pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       (this->indices,(long)(iVar8 + local_a4 * 3));
    *pvVar6 = iVar7 + local_a4;
    pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       (this->indices,(long)(iVar8 + local_a4 * 3 + 1));
    *pvVar6 = iVar7 + local_a4 + 2;
    pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       (this->indices,(long)(iVar8 + local_a4 * 3 + 2));
    *pvVar6 = iVar7 + local_a4 + 1;
    pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       (this->indices,(long)(iVar8 + local_a4 * 3 + 3));
    *pvVar6 = iVar7 + local_a4 + 1;
    pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       (this->indices,(long)(iVar8 + local_a4 * 3 + 4));
    *pvVar6 = iVar7 + local_a4 + 2;
    pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       (this->indices,(long)(iVar8 + local_a4 * 3 + 5));
    *pvVar6 = iVar7 + local_a4 + 3;
  }
  return;
}

Assistant:

void GeometryBackgroundBorder::DrawArcArc(Vector2f pos_center, float R, Vector2f r, float a0, float a1, ColourbPremultiplied color0,
	ColourbPremultiplied color1, int num_points)
{
	RMLUI_ASSERT(num_points >= 2 && R > 0 && r.x > 0 && r.y > 0);

	const int num_triangles = 2 * (num_points - 1);

	const int offset_vertices = (int)vertices.size();
	const int offset_indices = (int)indices.size();

	vertices.resize(offset_vertices + 2 * num_points);
	indices.resize(offset_indices + 3 * num_triangles);

	for (int i = 0; i < num_points; i++)
	{
		const float t = float(i) / float(num_points - 1);

		const float a = Math::Lerp(t, a0, a1);
		const ColourbPremultiplied color = Math::RoundedLerp(t, color0, color1);
		const Vector2f unit_vector(Math::Cos(a), Math::Sin(a));

		vertices[offset_vertices + 2 * i].position = unit_vector * r + pos_center;
		vertices[offset_vertices + 2 * i].colour = color;
		vertices[offset_vertices + 2 * i + 1].position = unit_vector * R + pos_center;
		vertices[offset_vertices + 2 * i + 1].colour = color;
	}

	for (int i = 0; i < num_triangles; i += 2)
	{
		indices[offset_indices + 3 * i + 0] = offset_vertices + i + 0;
		indices[offset_indices + 3 * i + 1] = offset_vertices + i + 2;
		indices[offset_indices + 3 * i + 2] = offset_vertices + i + 1;

		indices[offset_indices + 3 * i + 3] = offset_vertices + i + 1;
		indices[offset_indices + 3 * i + 4] = offset_vertices + i + 2;
		indices[offset_indices + 3 * i + 5] = offset_vertices + i + 3;
	}
}